

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_target_env.cpp
# Opt level: O3

bool spvParseVulkanEnv(uint32_t vulkan_ver,uint32_t spirv_ver,spv_target_env_conflict *env)

{
  long lVar1;
  
  lVar1 = 8;
  while ((*(uint *)(&UNK_0079c36c + lVar1) < vulkan_ver ||
         (*(uint *)((long)&ordered_vulkan_envs[0].vulkan_env + lVar1) < spirv_ver))) {
    lVar1 = lVar1 + 0xc;
    if (lVar1 == 0x50) {
      return false;
    }
  }
  *env = *(spv_target_env_conflict *)((long)ordered_universal_envs._M_elems + lVar1 + 0x18);
  return true;
}

Assistant:

bool spvParseVulkanEnv(uint32_t vulkan_ver, uint32_t spirv_ver,
                       spv_target_env* env) {
  for (auto triple : ordered_vulkan_envs) {
    if (triple.vulkan_ver >= vulkan_ver && triple.spirv_ver >= spirv_ver) {
      *env = triple.vulkan_env;
      return true;
    }
  }
  return false;
}